

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ashared_ptr.h
# Opt level: O0

bool __thiscall
ashared_ptr<MapWrapper>::compare_exchange
          (ashared_ptr<MapWrapper> *this,ashared_ptr<MapWrapper> *expected,
          ashared_ptr<MapWrapper> *src)

{
  bool bVar1;
  PtrWrapper<MapWrapper> *this_00;
  lock_guard<std::mutex> *in_RDX;
  ashared_ptr<MapWrapper> *in_RSI;
  ashared_ptr<MapWrapper> *in_RDI;
  lock_guard<std::mutex> l;
  PtrWrapper<MapWrapper> *val_ptr;
  PtrWrapper<MapWrapper> *expected_ptr;
  mutex_type *in_stack_ffffffffffffffa8;
  memory_order __m;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar2;
  ashared_ptr<MapWrapper> *in_stack_ffffffffffffffc8;
  ashared_ptr<MapWrapper> *in_stack_ffffffffffffffd0;
  ashared_ptr<MapWrapper> *this_01;
  undefined1 local_1;
  
  this_01 = in_RDI;
  std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load
            (&in_RDI->object,(memory_order)((ulong)in_RDX >> 0x20));
  this_00 = shareCurObject(in_stack_ffffffffffffffd0);
  std::lock_guard<std::mutex>::lock_guard(in_RDX,in_stack_ffffffffffffffa8);
  __m = (memory_order)((ulong)in_RDX >> 0x20);
  bVar1 = std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::compare_exchange_weak
                    ((atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*> *)this_00,
                     (__pointer_type *)in_stack_ffffffffffffffc8,
                     (__pointer_type)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (memory_order)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    std::atomic<ashared_ptr<MapWrapper>::PtrWrapper<MapWrapper>_*>::load(&in_RDI->object,__m);
    releaseObject(in_stack_ffffffffffffffc8,
                  (PtrWrapper<MapWrapper> *)
                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    local_1 = 1;
  }
  uVar2 = (uint)bVar1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1072ce);
  if (uVar2 == 0) {
    operator=(this_01,in_RSI);
    releaseObject(in_stack_ffffffffffffffc8,
                  (PtrWrapper<MapWrapper> *)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool compare_exchange(ashared_ptr<T>& expected, ashared_ptr<T> src) {
        // Note: it is OK that `expected` becomes outdated.
        PtrWrapper<T>* expected_ptr = expected.object.load(MO);
        PtrWrapper<T>* val_ptr = src.shareCurObject();

        { // Lock for `object`
            std::lock_guard<std::mutex> l(lock);
            if (object.compare_exchange_weak(expected_ptr, val_ptr)) {
                // Succeeded.
                // Release old object.
                releaseObject(expected.object.load(MO));
                return true;
            }
        }
        // Failed.
        expected = *this;
        // Release the object from `src`.
        releaseObject(val_ptr);
        return false;
    }